

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O0

int ctl_bymib(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
             size_t newlen)

{
  _Bool _Var1;
  ctl_named_node_t *pcVar2;
  void *in_RCX;
  ctl_named_node_t *in_RDX;
  size_t *in_RSI;
  tsd_t *in_RDI;
  size_t *in_R8;
  tsd_t *in_R9;
  size_t in_stack_00000008;
  ctl_indexed_node_t *inode;
  size_t i;
  ctl_named_node_t *node;
  int ret;
  ctl_indexed_node_t *in_stack_ffffffffffffffa8;
  ctl_named_node_t *node_00;
  ctl_named_node_t *local_48;
  int local_3c;
  
  if ((ctl_initialized) || (_Var1 = ctl_init(in_R9), !_Var1)) {
    local_48 = super_root_node;
    for (node_00 = (ctl_named_node_t *)0x0; node_00 < in_RDX;
        node_00 = (ctl_named_node_t *)&node_00->field_0x1) {
      pcVar2 = ctl_named_node(local_48->children);
      if (pcVar2 == (ctl_named_node_t *)0x0) {
        in_stack_ffffffffffffffa8 = ctl_indexed_node(local_48->children);
        local_48 = (*in_stack_ffffffffffffffa8->index)
                             ((tsdn_t *)in_RDI,in_RSI,(size_t)in_RDX,in_RSI[(long)node_00]);
        if (local_48 == (ctl_named_node_t *)0x0) {
          return 2;
        }
      }
      else {
        if (local_48->nchildren <= in_RSI[(long)node_00]) {
          return 2;
        }
        local_48 = ctl_named_children(node_00,(size_t)in_stack_ffffffffffffffa8);
      }
    }
    if ((local_48 == (ctl_named_node_t *)0x0) ||
       (local_48->ctl ==
        (_func_int_tsd_t_ptr_size_t_ptr_size_t_void_ptr_size_t_ptr_void_ptr_size_t *)0x0)) {
      local_3c = 2;
    }
    else {
      local_3c = (*local_48->ctl)(in_RDI,in_RSI,(size_t)in_RDX,in_RCX,in_R8,in_R9,in_stack_00000008)
      ;
    }
  }
  else {
    local_3c = 0xb;
  }
  return local_3c;
}

Assistant:

int
ctl_bymib(tsd_t *tsd, const size_t *mib, size_t miblen, void *oldp,
    size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	const ctl_named_node_t *node;
	size_t i;

	if (!ctl_initialized && ctl_init(tsd)) {
		ret = EAGAIN;
		goto label_return;
	}

	/* Iterate down the tree. */
	node = super_root_node;
	for (i = 0; i < miblen; i++) {
		assert(node);
		assert(node->nchildren > 0);
		if (ctl_named_node(node->children) != NULL) {
			/* Children are named. */
			if (node->nchildren <= mib[i]) {
				ret = ENOENT;
				goto label_return;
			}
			node = ctl_named_children(node, mib[i]);
		} else {
			const ctl_indexed_node_t *inode;

			/* Indexed element. */
			inode = ctl_indexed_node(node->children);
			node = inode->index(tsd_tsdn(tsd), mib, miblen, mib[i]);
			if (node == NULL) {
				ret = ENOENT;
				goto label_return;
			}
		}
	}

	/* Call the ctl function. */
	if (node && node->ctl) {
		ret = node->ctl(tsd, mib, miblen, oldp, oldlenp, newp, newlen);
	} else {
		/* Partial MIB. */
		ret = ENOENT;
	}

label_return:
	return(ret);
}